

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O3

void __thiscall bgui::BaseWindow::~BaseWindow(BaseWindow *this)

{
  pointer pcVar1;
  BaseWindowData *pBVar2;
  
  this->_vptr_BaseWindow = (_func_int **)&PTR__BaseWindow_00121bd0;
  sendClose(this);
  pBVar2 = this->p;
  if (pBVar2->running == true) {
    pthread_join(pBVar2->thread,(void **)0x0);
    pBVar2 = this->p;
    pBVar2->running = false;
  }
  pthread_mutex_destroy((pthread_mutex_t *)&pBVar2->mutex);
  pBVar2 = this->p;
  if (pBVar2->inotify_fd != 0) {
    close(pBVar2->inotify_fd);
    pBVar2 = this->p;
  }
  (*(pBVar2->image->f).destroy_image)(pBVar2->image);
  XFreeFontInfo(0,this->p->font,1);
  XFreeGC(this->p->display,this->p->gc);
  XDestroyWindow(this->p->display,this->p->window);
  XCloseDisplay(this->p->display);
  pBVar2 = this->p;
  if (pBVar2 != (BaseWindowData *)0x0) {
    pcVar1 = (pBVar2->text)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(pBVar2->text).field_2) {
      operator_delete(pcVar1);
    }
    pcVar1 = (pBVar2->info)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(pBVar2->info).field_2) {
      operator_delete(pcVar1);
    }
  }
  operator_delete(pBVar2);
  return;
}

Assistant:

BaseWindow::~BaseWindow()
{
  sendClose();
  waitForClose();

  pthread_mutex_destroy(&(p->mutex));

#ifdef INCLUDE_INOTIFY

  if (p->inotify_fd != 0)
  {
    close(p->inotify_fd);
  }

#endif

  XDestroyImage(p->image);
  XFreeFontInfo(0, p->font, 1);
  XFreeGC(p->display, p->gc);
  XDestroyWindow(p->display, p->window);
  XCloseDisplay(p->display);

  delete p;
}